

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringOneofFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = HasHazzer((this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_string_field_lite.cc"
               ,0x1c7);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,GETTER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldStringBytesAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,GETTER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  return instance.get$capitalized_name$Bytes();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  WriteFieldStringBytesAccessorDocComment
            (local_18,(this->super_ImmutableStringFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(local_18,&(this->super_ImmutableStringFieldLiteGenerator).variables_,
                     "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Bytes(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableStringFieldLiteGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  return instance.get$capitalized_name$();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  return instance.get$capitalized_name$Bytes();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  copyOnWrite();\n"
      "  instance.set$capitalized_name$Bytes(value);\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}